

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.hpp
# Opt level: O1

void __thiscall
AssignmentNode::AssignmentNode
          (AssignmentNode *this,string *name,AssignmentOperator *operation,
          unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *value)

{
  pointer pcVar1;
  
  (this->super_StatementNode).super_Node.mark_.line = 1;
  (this->super_StatementNode).super_Node.mark_.column = 0;
  (this->super_StatementNode).super_Node._vptr_Node = (_func_int **)&PTR__AssignmentNode_00157990;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name_,pcVar1,pcVar1 + name->_M_string_length);
  this->operator_ = *operation;
  std::__shared_ptr<ExpressionNode,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<ExpressionNode,std::default_delete<ExpressionNode>,void>
            ((__shared_ptr<ExpressionNode,(__gnu_cxx::_Lock_policy)2> *)&this->value_,value);
  return;
}

Assistant:

AssignmentNode(const std::string& name, 
    const AssignmentOperator& operation, std::unique_ptr<ExpressionNode> value):
      name_(name), operator_(operation), value_(std::move(value)) {}